

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall
addrman_tests::caddrinfo_get_tried_bucket_legacy::test_method
          (caddrinfo_get_tried_bucket_legacy *this)

{
  size_type *psVar1;
  long lVar2;
  string *psVar3;
  int iVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  long in_FS_OFFSET;
  bool bVar11;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar12;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  int local_544;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  direct_or_indirect local_430;
  uint local_420;
  undefined1 *local_418;
  uint16_t local_410;
  undefined1 local_408 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  direct_or_indirect local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  string local_3a8;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  direct_or_indirect local_368;
  uint local_358;
  char *local_350;
  uint16_t local_348;
  int bucket;
  undefined4 uStack_33c;
  undefined8 local_338;
  shared_count sStack_330;
  char *local_328;
  uint16_t local_320;
  NodeSeconds local_318;
  ServiceFlags local_310;
  AddrInfo infoi;
  set<int,_std::less<int>,_std::allocator<int>_> buckets;
  AddrInfo info2;
  uint256 nKey2;
  uint256 nKey1;
  AddrInfo info1;
  CNetAddr source1;
  direct_or_indirect local_f8;
  uint local_e8;
  Network local_e0;
  uint32_t uStack_dc;
  uint16_t local_d8;
  CAddress addr2;
  direct_or_indirect local_98;
  uint local_88;
  Network local_80;
  uint32_t uStack_7c;
  uint16_t local_78;
  CAddress addr1;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = &info1.super_CAddress.super_CService.super_CNetAddr.m_addr._size;
  info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&info1,"250.1.1.1","");
  ResolveService((CService *)&local_98.indirect_contents,(string *)&info1,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  addr1.super_CService.super_CNetAddr.m_net = local_80;
  addr1.super_CService.super_CNetAddr.m_scope_id = uStack_7c;
  addr1.super_CService.port = local_78;
  addr1.nTime.__d.__r = (duration)100000000;
  addr1.nServices = NODE_NONE;
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)
      info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.
                    indirect_contents.indirect,
                    CONCAT44(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_,
                             info1.super_CAddress.super_CService.super_CNetAddr.m_addr._size) + 1);
  }
  info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&info1,"250.1.1.1","");
  ResolveService((CService *)&local_f8.indirect_contents,(string *)&info1,9999);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  addr2.super_CService.super_CNetAddr.m_net = local_e0;
  addr2.super_CService.super_CNetAddr.m_scope_id = uStack_dc;
  addr2.super_CService.port = local_d8;
  addr2.nTime.__d.__r = (duration)100000000;
  addr2.nServices = NODE_NONE;
  if (0x10 < local_e8) {
    free(local_f8.indirect_contents.indirect);
    local_f8.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)
      info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.
                    indirect_contents.indirect,
                    CONCAT44(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_,
                             info1.super_CAddress.super_CService.super_CNetAddr.m_addr._size) + 1);
  }
  info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&info1,"250.1.1.1","");
  ResolveIP(&source1,(string *)&info1);
  if ((size_type *)
      info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.
                    indirect_contents.indirect,
                    CONCAT44(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_,
                             info1.super_CAddress.super_CService.super_CNetAddr.m_addr._size) + 1);
  }
  AddrInfo::AddrInfo(&info1,&addr1,&source1);
  info2.source.m_addr._union._8_8_ = 0;
  info2.source.m_addr._size = 0;
  info2.source.m_addr._20_4_ = 0;
  info2.m_last_count_attempt.__d.__r = (duration)0;
  info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  info2.super_CAddress.nServices = NODE_NONE;
  info2.m_last_try.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.port = 0;
  info2.super_CAddress.super_CService._34_6_ = 0;
  info2.super_CAddress.nTime.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  info2.super_CAddress.super_CService.super_CNetAddr.m_scope_id = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  info2.source.m_net = NET_UNROUTABLE;
  info2.source.m_scope_id = 0;
  CSHA256::CSHA256((CSHA256 *)&info2);
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._0_4_ = 1;
  CSHA256::Write((CSHA256 *)&info2,(uchar *)&infoi,4);
  HashWriter::GetHash(&nKey1,(HashWriter *)&info2);
  info2.source.m_addr._union._8_8_ = 0;
  info2.source.m_addr._size = 0;
  info2.source.m_addr._20_4_ = 0;
  info2.m_last_count_attempt.__d.__r = (duration)0;
  info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  info2.super_CAddress.nServices = NODE_NONE;
  info2.m_last_try.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.port = 0;
  info2.super_CAddress.super_CService._34_6_ = 0;
  info2.super_CAddress.nTime.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  info2.super_CAddress.super_CService.super_CNetAddr.m_scope_id = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  info2.source.m_net = NET_UNROUTABLE;
  info2.source.m_scope_id = 0;
  CSHA256::CSHA256((CSHA256 *)&info2);
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._0_4_ = 2;
  CSHA256::Write((CSHA256 *)&info2,(uchar *)&infoi,4);
  HashWriter::GetHash(&nKey2,(HashWriter *)&info2);
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1d6;
  file.m_begin = (iterator)&local_480;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_490,msg);
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_013abb30;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = "";
  local_3e8._M_allocated_capacity._0_4_ = AddrInfo::GetTriedBucket(&info1,&nKey1,&EMPTY_NETGROUPMAN)
  ;
  local_3a8._M_dataplus._M_p = (pointer)&local_3e8;
  local_3c8.indirect_contents.indirect = local_408;
  buckets._M_t._M_impl._0_1_ = local_3e8._M_allocated_capacity._0_4_ == 0x28;
  local_408._0_4_ = 0x28;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_388._8_8_ = "";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3c8;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&buckets,(lazy_ostream *)&bucket,1,2,REQUIRE,0xe53832,
             (size_t)local_388,0x1d6,&info2,"40",&infoi);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1da;
  file_00.m_begin = (iterator)&local_4a0;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4b0,
             msg_00);
  iVar4 = AddrInfo::GetTriedBucket(&info1,&nKey1,&EMPTY_NETGROUPMAN);
  _cVar12 = 0x2358be;
  iVar5 = AddrInfo::GetTriedBucket(&info1,&nKey2,&EMPTY_NETGROUPMAN);
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.direct[0] = iVar4 != iVar5;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  _bucket = (undefined **)0xe53861;
  local_338 = (long)
              "info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info1.GetTriedBucket(nKey2, EMPTY_NETGROUPMAN)"
              + 0x60;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4b8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = (lazy_ostream *)&bucket;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&infoi,(lazy_ostream *)&info2,1,0,WARN,_cVar12,(size_t)&local_4c0,
             0x1da);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size);
  AddrInfo::AddrInfo(&info2,&addr2,&source1);
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1e0;
  file_01.m_begin = (iterator)&local_4d0;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4e0,
             msg_01);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets,
                   (CService *)&info1);
  _cVar12 = 0x2359de;
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388,
                   (CService *)&info2);
  bVar11 = true;
  if (buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - buckets._M_t._M_impl._0_8_ ==
      local_388._8_8_ - local_388._0_8_) {
    if (buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == buckets._M_t._M_impl._0_8_) {
      bVar11 = false;
    }
    else {
      _cVar12 = 0x235a18;
      iVar4 = bcmp((void *)buckets._M_t._M_impl._0_8_,(void *)local_388._0_8_,
                   buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                   buckets._M_t._M_impl._0_8_);
      bVar11 = iVar4 != 0;
    }
  }
  bucket._0_1_ = bVar11;
  local_338 = (element_type *)0x0;
  sStack_330.pi_ = (sp_counted_base *)0x0;
  local_3a8._M_dataplus._M_p = "info1.GetKey() != info2.GetKey()";
  local_3a8._M_string_length = 0xe538e2;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4e8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,_cVar12,(size_t)&local_4f0,
             0x1e0);
  boost::detail::shared_count::~shared_count(&sStack_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_388._0_8_,local_378._M_allocated_capacity - local_388._0_8_);
  }
  if (buckets._M_t._M_impl._0_8_ != 0) {
    operator_delete((void *)buckets._M_t._M_impl._0_8_,
                    (long)buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                    buckets._M_t._M_impl._0_8_);
  }
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1e1;
  file_02.m_begin = (iterator)&local_500;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_510,
             msg_02);
  iVar4 = AddrInfo::GetTriedBucket(&info1,&nKey1,&EMPTY_NETGROUPMAN);
  _cVar12 = 0x235b5f;
  iVar5 = AddrInfo::GetTriedBucket(&info2,&nKey1,&EMPTY_NETGROUPMAN);
  bucket._0_1_ = iVar4 != iVar5;
  local_338 = (element_type *)0x0;
  sStack_330.pi_ = (sp_counted_base *)0x0;
  buckets._M_t._M_impl._0_8_ = anon_var_dwarf_1a3b93;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)
       "info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info2.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN)"
       + 0x60;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_518 = "";
  pvVar9 = (iterator)0x0;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &buckets;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,_cVar12,(size_t)&local_520,
             0x1e1);
  boost::detail::shared_count::~shared_count(&sStack_330);
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &buckets._M_t._M_impl.super__Rb_tree_header._M_header;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450._M_dataplus._M_p = (pointer)((ulong)local_450._M_dataplus._M_p._4_4_ << 0x20);
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    util::ToString<int>(&local_3a8,(int *)&local_450);
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_3a8,0,0,"250.1.1.",8);
    local_388._0_8_ = &local_378;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if (paVar8 == paVar7) {
      local_378._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_378._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_378._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_388._0_8_ = paVar8;
    }
    local_388._8_8_ = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)&local_368.indirect_contents,(string *)local_388,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_368.indirect_contents);
    local_328 = local_350;
    local_320 = local_348;
    local_318.__d.__r = (duration)100000000;
    local_310 = NODE_NONE;
    util::ToString<int>((string *)local_408,(int *)&local_450);
    pvVar10 = &DAT_00000008;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)local_408,0,0,"250.1.1.",8);
    local_3e8._M_allocated_capacity = (size_type)(pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_allocated_capacity == paVar8) {
      local_3d8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_3d8._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_3e8._M_allocated_capacity = (size_type)&local_3d8;
    }
    else {
      local_3d8._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_3e8._8_8_ = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    ResolveIP((CNetAddr *)&local_3c8,(string *)&local_3e8);
    AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_3c8);
    if (0x10 < (uint)local_3b8._M_allocated_capacity._0_4_) {
      free(local_3c8.indirect_contents.indirect);
      local_3c8.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_allocated_capacity != &local_3d8) {
      operator_delete((void *)local_3e8._M_allocated_capacity,local_3d8._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
      operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
    }
    if (0x10 < (uint)sStack_330.pi_) {
      free(_bucket);
      _bucket = (_func_int **)0x0;
    }
    if (0x10 < local_358) {
      free(local_368.indirect_contents.indirect);
      local_368.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._0_8_ != &local_378) {
      operator_delete((void *)local_388._0_8_,(ulong)(local_378._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    iVar4 = AddrInfo::GetTriedBucket(&infoi,&nKey1,&EMPTY_NETGROUPMAN);
    bucket = iVar4;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    if (0x10 < infoi.source.m_addr._size) {
      free(infoi.source.m_addr._union.indirect_contents.indirect);
      infoi.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size) {
      free(infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
           indirect);
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           (char *)0x0;
    }
    iVar4 = (int)local_450._M_dataplus._M_p;
    local_450._M_dataplus._M_p._0_4_ = (int)local_450._M_dataplus._M_p + 1;
  } while (iVar4 < 0xfe);
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1ed;
  file_03.m_begin = (iterator)&local_530;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_540,
             msg_03);
  local_388._8_8_ = local_388._8_8_ & 0xffffffffffffff00;
  local_388._0_8_ = &PTR__lazy_ostream_013abb30;
  local_378._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_378._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_450._M_dataplus._M_p = (pointer)buckets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_408._0_8_ = &local_470;
  local_470._M_dataplus._M_p._0_4_ = 8;
  local_3a8._M_dataplus._M_p._0_1_ = buckets._M_t._M_impl.super__Rb_tree_header._M_node_count == 8;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_3c8.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3c8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_3e8._M_allocated_capacity = (size_type)&local_450;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3e8;
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_013abbb0;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = local_408;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,2,REQUIRE,0xfb9bf2,
             (size_t)&local_3c8,0x1ed,&infoi,"8U",(CAddress *)&bucket);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&buckets._M_t);
  local_544 = 0;
  do {
    util::ToString<int>((string *)&local_3c8,&local_544);
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)&local_3c8,0,0,"250.",4);
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if (paVar8 == paVar7) {
      local_3a8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_3a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_3a8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_3a8._M_dataplus._M_p = (pointer)paVar8;
    }
    local_3a8._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_3a8,".1.1");
    local_388._0_8_ = &local_378;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if (paVar8 == paVar7) {
      local_378._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_378._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_378._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_388._0_8_ = paVar8;
    }
    local_388._8_8_ = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)&local_430.indirect_contents,(string *)local_388,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_430.indirect_contents);
    local_328 = local_418;
    local_320 = local_410;
    local_318.__d.__r = (duration)100000000;
    local_310 = NODE_NONE;
    util::ToString<int>(&local_470,&local_544);
    pvVar10 = (iterator)0x4;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_470,0,0,"250.",4);
    local_450._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p == paVar8) {
      local_450.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_450.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    }
    else {
      local_450.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_450._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_450,".1.1");
    local_408._0_8_ = local_408 + 0x10;
    psVar3 = (string *)(pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if (psVar3 == (string *)paVar8) {
      local_408._16_8_ = paVar8->_M_allocated_capacity;
      local_408._24_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_408._16_8_ = paVar8->_M_allocated_capacity;
      local_408._0_8_ = psVar3;
    }
    local_408._8_8_ = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    ResolveIP((CNetAddr *)&local_3e8,(string *)local_408);
    AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_3e8);
    if (0x10 < (uint)local_3d8._M_allocated_capacity._0_4_) {
      free((void *)local_3e8._M_allocated_capacity);
      local_3e8._M_allocated_capacity = 0;
    }
    if ((string *)local_408._0_8_ != (string *)(local_408 + 0x10)) {
      operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_470._M_dataplus._M_p._4_4_,local_470._M_dataplus._M_p._0_4_) !=
        &local_470.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_470._M_dataplus._M_p._4_4_,local_470._M_dataplus._M_p._0_4_),
                      local_470.field_2._M_allocated_capacity + 1);
    }
    if (0x10 < (uint)sStack_330.pi_) {
      free(_bucket);
      _bucket = (_func_int **)0x0;
    }
    if (0x10 < local_420) {
      free(local_430.indirect_contents.indirect);
      local_430.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._0_8_ != &local_378) {
      operator_delete((void *)local_388._0_8_,(ulong)(local_378._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.indirect_contents.indirect != &local_3b8) {
      operator_delete(local_3c8.indirect_contents.indirect,
                      CONCAT44(local_3b8._M_allocated_capacity._4_4_,
                               local_3b8._M_allocated_capacity._0_4_) + 1);
    }
    iVar4 = AddrInfo::GetTriedBucket(&infoi,&nKey1,&EMPTY_NETGROUPMAN);
    bucket = iVar4;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    if (0x10 < infoi.source.m_addr._size) {
      free(infoi.source.m_addr._union.indirect_contents.indirect);
      infoi.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size) {
      free(infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
           indirect);
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           (char *)0x0;
    }
    iVar4 = local_544 + 1;
    bVar11 = local_544 < 0xfe;
    local_544 = iVar4;
  } while (bVar11);
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1f9;
  file_04.m_begin = (iterator)&local_558;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_568,
             msg_04);
  local_388._8_8_ = local_388._8_8_ & 0xffffffffffffff00;
  local_388._0_8_ = &PTR__lazy_ostream_013abb30;
  local_378._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_378._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_450._M_dataplus._M_p = (pointer)buckets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_3a8._M_dataplus._M_p._0_1_ =
       buckets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0xa0;
  local_470._M_dataplus._M_p._0_4_ = 0xa0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_3c8.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3c8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_3e8._M_allocated_capacity = (size_type)&local_450;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3e8;
  local_408._0_8_ = &local_470;
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_013abbb0;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = local_408;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,2,REQUIRE,0xfb9bf2,
             (size_t)&local_3c8,0x1f9,&infoi,"160U",(CAddress *)&bucket);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&buckets._M_t);
  if (0x10 < info2.source.m_addr._size) {
    free(info2.source.m_addr._union.indirect_contents.indirect);
    info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size) {
    free(info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect
        );
    info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)0x0;
  }
  if (0x10 < info1.source.m_addr._size) {
    free(info1.source.m_addr._union.indirect_contents.indirect);
    info1.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < info1.super_CAddress.super_CService.super_CNetAddr.m_addr._size) {
    free(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect
        );
    info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)0x0;
  }
  if (0x10 < source1.m_addr._size) {
    free(source1.m_addr._union.indirect_contents.indirect);
    source1.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr2.super_CService.super_CNetAddr.m_addr._size) {
    free(addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr1.super_CService.super_CNetAddr.m_addr._size) {
    free(addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddrinfo_get_tried_bucket_legacy)
{
    CAddress addr1 = CAddress(ResolveService("250.1.1.1", 8333), NODE_NONE);
    CAddress addr2 = CAddress(ResolveService("250.1.1.1", 9999), NODE_NONE);

    CNetAddr source1 = ResolveIP("250.1.1.1");


    AddrInfo info1 = AddrInfo(addr1, source1);

    uint256 nKey1 = (HashWriter{} << 1).GetHash();
    uint256 nKey2 = (HashWriter{} << 2).GetHash();

    BOOST_CHECK_EQUAL(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN), 40);

    // Test: Make sure key actually randomizes bucket placement. A fail on
    //  this test could be a security issue.
    BOOST_CHECK(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info1.GetTriedBucket(nKey2, EMPTY_NETGROUPMAN));

    // Test: Two addresses with same IP but different ports can map to
    //  different buckets because they have different keys.
    AddrInfo info2 = AddrInfo(addr2, source1);

    BOOST_CHECK(info1.GetKey() != info2.GetKey());
    BOOST_CHECK(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info2.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN));

    std::set<int> buckets;
    for (int i = 0; i < 255; i++) {
        AddrInfo infoi = AddrInfo(
            CAddress(ResolveService("250.1.1." + ToString(i)), NODE_NONE),
            ResolveIP("250.1.1." + ToString(i)));
        int bucket = infoi.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same /16 prefix should
    // never get more than 8 buckets with legacy grouping
    BOOST_CHECK_EQUAL(buckets.size(), 8U);

    buckets.clear();
    for (int j = 0; j < 255; j++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250." + ToString(j) + ".1.1"), NODE_NONE),
            ResolveIP("250." + ToString(j) + ".1.1"));
        int bucket = infoj.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different /16 prefix should map to more than
    // 8 buckets with legacy grouping
    BOOST_CHECK_EQUAL(buckets.size(), 160U);
}